

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall UnitTestBasehello22::~UnitTestBasehello22(UnitTestBasehello22 *this)

{
  UnitTestBase::~UnitTestBase(&this->super_UnitTestBase);
  operator_delete(this);
  return;
}

Assistant:

TEST_CASE(hello22)
{
    Regex r("x(a(b|c))*(d|e)");

    EXPECT_TRUE(r.Match("xacabe"));
    EXPECT_TRUE(!r.Match("xbcbe"));
    EXPECT_TRUE(r.Match("xe"));

    EXPECT_FALSE(r.Match(""));
    EXPECT_FALSE(r.Match("xbd"));
}